

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall libcellml::UnitsItem::isValid(UnitsItem *this)

{
  ulong uVar1;
  bool bVar2;
  element_type *this_00;
  size_t sVar3;
  undefined1 local_28 [8];
  shared_ptr<libcellml::Units> units;
  UnitsItem *this_local;
  
  units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::weak_ptr<libcellml::Units>::lock((weak_ptr<libcellml::Units> *)local_28);
  bVar2 = std::operator!=((shared_ptr<libcellml::Units> *)local_28,(nullptr_t)0x0);
  if (bVar2) {
    uVar1 = this->mPimpl->mIndex;
    this_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    sVar3 = Units::unitCount(this_00);
    this_local._7_1_ = uVar1 < sVar3;
  }
  else {
    this_local._7_1_ = false;
  }
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_28);
  return this_local._7_1_;
}

Assistant:

bool UnitsItem::isValid() const
{
    auto units = mPimpl->mUnits.lock();
    if (units != nullptr) {
        return mPimpl->mIndex < units->unitCount();
    }

    return false;
}